

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O2

typed_value<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_char> * __thiscall
VW::config::options_boost_po::add_notifier<unsigned_int>
          (options_boost_po *this,shared_ptr<VW::config::typed_option<unsigned_int>_> *opt,
          typed_value<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_char> *po_value)

{
  __shared_ptr<VW::config::typed_option<unsigned_int>,_(__gnu_cxx::_Lock_policy)2> local_40;
  function1<void,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&> local_30;
  
  std::__shared_ptr<VW::config::typed_option<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_40,
               &opt->
                super___shared_ptr<VW::config::typed_option<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>
              );
  boost::function1<void,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>::
  function1<VW::config::options_boost_po::add_notifier<unsigned_int>(std::shared_ptr<VW::config::typed_option<unsigned_int>>&,boost::program_options::typed_value<std::vector<unsigned_int,std::allocator<unsigned_int>>,char>*)::_lambda(std::vector<unsigned_int,std::allocator<unsigned_int>>)_1_>
            ((function1<void,std::vector<unsigned_int,std::allocator<unsigned_int>>const&> *)
             &local_30,(functor_type_conflict *)&local_40,0);
  boost::function1<void,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>::
  operator=(&po_value->m_notifier,&local_30);
  boost::function1<void,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&>::
  ~function1(&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  return po_value;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::add_notifier(
    std::shared_ptr<typed_option<T>>& opt, po::typed_value<std::vector<T>>* po_value)
{
  return po_value->notifier([opt](std::vector<T> final_arguments) {
    T first = final_arguments[0];
    for (auto const& item : final_arguments)
    {
      if (item != first)
      {
        std::stringstream ss;
        ss << "Disagreeing option values for '" << opt->m_name << "': '" << first << "' vs '" << item << "'";
        THROW_EX(VW::vw_argument_disagreement_exception, ss.str());
      }
    }

    // Set the value for the listening location.
    opt->m_location = first;
    opt->value(first);
  });
}